

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

void __thiscall
soul::AST::Scope::NameSearch::
addFirstMatching<std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>>>>
          (NameSearch *this,
          vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
          *array)

{
  size_t sVar1;
  pointer ppVar2;
  pointer ppVar3;
  
  sVar1 = (this->partiallyQualifiedPath).pathSections.numActive;
  if (sVar1 == 0) {
    throwInternalCompilerError("! empty()","back",0xaa);
  }
  ppVar3 = (array->
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (array->
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar3 != ppVar2) {
    do {
      if ((ppVar3->object->name).name ==
          (this->partiallyQualifiedPath).pathSections.items[sVar1 - 1].name) {
        addResult(this,(ASTObject *)ppVar3->object);
        return;
      }
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != ppVar2);
  }
  return;
}

Assistant:

void addFirstMatching (const ArrayType& array)
            {
                addFirstWithName (array, partiallyQualifiedPath.getLastPart());
            }